

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatzinc.cpp
# Opt level: O3

VarBranch FlatZinc::ann2ivarsel(Node *ann)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char local_19;
  
  if ((ann != (Node *)0x0) &&
     (lVar2 = __dynamic_cast(ann,&AST::Node::typeinfo,&AST::Atom::typeinfo,0), lVar2 != 0)) {
    pcVar3 = (char *)(lVar2 + 8);
    iVar1 = std::__cxx11::string::compare(pcVar3);
    if (iVar1 == 0) {
      return VAR_INORDER;
    }
    iVar1 = std::__cxx11::string::compare(pcVar3);
    if (iVar1 == 0) {
      return VAR_SIZE_MIN;
    }
    iVar1 = std::__cxx11::string::compare(pcVar3);
    if (iVar1 == 0) {
      return VAR_SIZE_MAX;
    }
    iVar1 = std::__cxx11::string::compare(pcVar3);
    if (iVar1 == 0) {
      return VAR_MIN_MIN;
    }
    iVar1 = std::__cxx11::string::compare(pcVar3);
    if (iVar1 == 0) {
      return VAR_MAX_MIN;
    }
    iVar1 = std::__cxx11::string::compare(pcVar3);
    if (iVar1 == 0) {
      return VAR_MAX_MAX;
    }
    iVar1 = std::__cxx11::string::compare(pcVar3);
    if (iVar1 == 0) {
      return VAR_MIN_MAX;
    }
    iVar1 = std::__cxx11::string::compare(pcVar3);
    if (iVar1 == 0) {
      return VAR_DEGREE_MAX;
    }
    iVar1 = std::__cxx11::string::compare(pcVar3);
    if (iVar1 == 0) {
      return VAR_SIZE_MIN;
    }
    iVar1 = std::__cxx11::string::compare(pcVar3);
    if (iVar1 == 0) {
      return VAR_REGRET_MIN_MAX;
    }
    iVar1 = std::__cxx11::string::compare(pcVar3);
    if (iVar1 == 0) {
      return VAR_RANDOM;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "% Warning: Unknown or not support variable selection annotation \'",0x41);
  (*ann->_vptr_Node[2])(ann,&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "\'! Ignore variable selection annotation and replace it by \'input_order\'.",0x48);
  local_19 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,&local_19,1);
  return VAR_INORDER;
}

Assistant:

VarBranch ann2ivarsel(AST::Node* ann) {
	if (auto* s = dynamic_cast<AST::Atom*>(ann)) {
		if (s->id == "input_order") {
			return VAR_INORDER;
		}
		if (s->id == "first_fail") {
			return VAR_SIZE_MIN;
		}
		if (s->id == "anti_first_fail") {
			return VAR_SIZE_MAX;
		}
		if (s->id == "smallest") {
			return VAR_MIN_MIN;
		}
		if (s->id == "smallest_largest") {
			return VAR_MAX_MIN;
		}
		if (s->id == "largest") {
			return VAR_MAX_MAX;
		}
		if (s->id == "largest_smallest") {
			return VAR_MIN_MAX;
		}
		if (s->id == "occurrence") {
			return VAR_DEGREE_MAX;
		}
		if (s->id == "most_constrained") {
			return VAR_SIZE_MIN;
		}
		if (s->id == "max_regret") {
			return VAR_REGRET_MIN_MAX;
		}
		if (s->id == "random_order") {
			return VAR_RANDOM;
		}
#ifdef HAS_VAR_IMPACT
		if (s->id == "impact") return VAR_IMPACT;
#endif
	}
	std::cerr << "% Warning: Unknown or not support variable selection annotation '";
	ann->print(std::cerr);
	std::cerr << "'! Ignore variable selection annotation and replace it by 'input_order'." << '\n';
	return VAR_INORDER;
}